

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::GetNavInputAmount2d
                 (ImGuiNavDirSourceFlags dir_sources,ImGuiInputReadMode mode,float slow_factor,
                 float fast_factor)

{
  ImVec2 IVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar2 = 0.0;
  fVar7 = 0.0;
  if ((dir_sources & 1U) != 0) {
    fVar2 = (float)(int)(GImGui->IO).KeysData[0x202].Down -
            (float)(int)(GImGui->IO).KeysData[0x201].Down;
    fVar7 = (float)(int)(GImGui->IO).KeysData[0x204].Down -
            (float)(int)(GImGui->IO).KeysData[0x203].Down;
  }
  if ((dir_sources & 2U) != 0) {
    fVar3 = GetNavInputAmount(0x11,mode);
    fVar4 = GetNavInputAmount(0x10,mode);
    fVar5 = GetNavInputAmount(0x13,mode);
    fVar6 = GetNavInputAmount(0x12,mode);
    fVar2 = (fVar3 - fVar4) + fVar2;
    fVar7 = fVar7 + (fVar5 - fVar6);
  }
  if ((dir_sources & 4U) != 0) {
    fVar3 = GetNavInputAmount(5,mode);
    fVar4 = GetNavInputAmount(4,mode);
    fVar5 = GetNavInputAmount(7,mode);
    fVar6 = GetNavInputAmount(6,mode);
    fVar2 = (fVar3 - fVar4) + fVar2;
    fVar7 = fVar7 + (fVar5 - fVar6);
  }
  if ((dir_sources & 8U) != 0) {
    fVar3 = GetNavInputAmount(9,mode);
    fVar4 = GetNavInputAmount(8,mode);
    fVar5 = GetNavInputAmount(0xb,mode);
    fVar6 = GetNavInputAmount(10,mode);
    fVar2 = (fVar3 - fVar4) + fVar2;
    fVar7 = fVar7 + (fVar5 - fVar6);
  }
  if (((slow_factor != 0.0) || (NAN(slow_factor))) && (0.0 < (GImGui->IO).NavInputs[0xe])) {
    fVar2 = fVar2 * slow_factor;
    fVar7 = fVar7 * slow_factor;
  }
  if (((fast_factor != 0.0) || (NAN(fast_factor))) && (0.0 < (GImGui->IO).NavInputs[0xf])) {
    fVar2 = fVar2 * fast_factor;
    fVar7 = fVar7 * fast_factor;
  }
  IVar1.y = fVar7;
  IVar1.x = fVar2;
  return IVar1;
}

Assistant:

ImVec2 ImGui::GetNavInputAmount2d(ImGuiNavDirSourceFlags dir_sources, ImGuiInputReadMode mode, float slow_factor, float fast_factor)
{
    ImVec2 delta(0.0f, 0.0f);
    if (dir_sources & ImGuiNavDirSourceFlags_RawKeyboard)
        delta += ImVec2((float)IsKeyDown(ImGuiKey_RightArrow) - (float)IsKeyDown(ImGuiKey_LeftArrow), (float)IsKeyDown(ImGuiKey_DownArrow) - (float)IsKeyDown(ImGuiKey_UpArrow));
    if (dir_sources & ImGuiNavDirSourceFlags_Keyboard)
        delta += ImVec2(GetNavInputAmount(ImGuiNavInput_KeyRight_, mode)   - GetNavInputAmount(ImGuiNavInput_KeyLeft_,   mode), GetNavInputAmount(ImGuiNavInput_KeyDown_,   mode) - GetNavInputAmount(ImGuiNavInput_KeyUp_,   mode));
    if (dir_sources & ImGuiNavDirSourceFlags_PadDPad)
        delta += ImVec2(GetNavInputAmount(ImGuiNavInput_DpadRight, mode)   - GetNavInputAmount(ImGuiNavInput_DpadLeft,   mode), GetNavInputAmount(ImGuiNavInput_DpadDown,   mode) - GetNavInputAmount(ImGuiNavInput_DpadUp,   mode));
    if (dir_sources & ImGuiNavDirSourceFlags_PadLStick)
        delta += ImVec2(GetNavInputAmount(ImGuiNavInput_LStickRight, mode) - GetNavInputAmount(ImGuiNavInput_LStickLeft, mode), GetNavInputAmount(ImGuiNavInput_LStickDown, mode) - GetNavInputAmount(ImGuiNavInput_LStickUp, mode));
    if (slow_factor != 0.0f && IsNavInputDown(ImGuiNavInput_TweakSlow))
        delta *= slow_factor;
    if (fast_factor != 0.0f && IsNavInputDown(ImGuiNavInput_TweakFast))
        delta *= fast_factor;
    return delta;
}